

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_popup_begin(nk_context *ctx,nk_popup_type type,char *title,nk_flags flags,nk_rect rect)

{
  float fVar1;
  float fVar2;
  nk_window *win_00;
  nk_size nVar3;
  nk_buffer *pnVar4;
  nk_handle nVar5;
  nk_size nVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  nk_hash nVar11;
  nk_panel *pnVar12;
  nk_rect r;
  nk_panel *local_78;
  nk_panel *root_1;
  nk_panel *root;
  nk_size allocated;
  nk_hash title_hash;
  int title_len;
  nk_panel *panel;
  nk_window *win;
  nk_window *popup;
  nk_flags flags_local;
  char *title_local;
  nk_popup_type type_local;
  nk_context *ctx_local;
  float fStack_18;
  nk_rect rect_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x41ad,
                  "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
                 );
  }
  if (title == (char *)0x0) {
    __assert_fail("title",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x41ae,
                  "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
                 );
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x41af,
                  "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
                 );
  }
  if (ctx->current->layout != (nk_panel *)0x0) {
    if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
       (ctx->current->layout == (nk_panel *)0x0)) {
      rect_local.w = 0.0;
    }
    else {
      win_00 = ctx->current;
      if ((win_00->layout->type &
          (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP)) !=
          NK_PANEL_NONE) {
        __assert_fail("!(panel->type & NK_PANEL_SET_POPUP) && \"popups are not allowed to have popups\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                      ,0x41b6,
                      "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
                     );
      }
      iVar10 = nk_strlen(title);
      nVar11 = nk_murmur_hash(title,iVar10,4);
      win = (win_00->popup).win;
      if (win == (nk_window *)0x0) {
        win = (nk_window *)nk_create_window(ctx);
        win->parent = win_00;
        (win_00->popup).win = win;
        (win_00->popup).active = 0;
        (win_00->popup).type = NK_PANEL_POPUP;
      }
      if ((win_00->popup).name != nVar11) {
        if ((win_00->popup).active != 0) {
          return 0;
        }
        nk_zero(win,0x1d8);
        (win_00->popup).name = nVar11;
        (win_00->popup).active = 1;
        (win_00->popup).type = NK_PANEL_POPUP;
      }
      ctx->current = win;
      fVar1 = (win_00->layout->clip).x;
      ctx_local._4_4_ = rect.x;
      fStack_18 = rect.y;
      fVar2 = (win_00->layout->clip).y;
      win->parent = win_00;
      (win->bounds).x = fVar1 + ctx_local._4_4_;
      (win->bounds).y = fVar2 + fStack_18;
      (win->bounds).w = (float)(int)rect._8_8_;
      (win->bounds).h = (float)(int)((ulong)rect._8_8_ >> 0x20);
      win->seq = ctx->seq;
      pnVar12 = (nk_panel *)nk_create_panel(ctx);
      win->layout = pnVar12;
      win->flags = flags;
      win->flags = win->flags | 1;
      if (type == NK_POPUP_DYNAMIC) {
        win->flags = win->flags | 0x800;
      }
      pnVar4 = (win_00->buffer).base;
      fVar8 = (win_00->buffer).clip.x;
      fVar9 = (win_00->buffer).clip.y;
      fVar1 = (win_00->buffer).clip.w;
      fVar2 = (win_00->buffer).clip.h;
      iVar10 = (win_00->buffer).use_clipping;
      uVar7 = *(undefined4 *)&(win_00->buffer).field_0x1c;
      nVar5 = (win_00->buffer).userdata;
      nVar3 = (win_00->buffer).begin;
      nVar6 = (win_00->buffer).last;
      (win->buffer).end = (win_00->buffer).end;
      (win->buffer).last = nVar6;
      (win->buffer).userdata = nVar5;
      (win->buffer).begin = nVar3;
      (win->buffer).clip.w = fVar1;
      (win->buffer).clip.h = fVar2;
      (win->buffer).use_clipping = iVar10;
      *(undefined4 *)&(win->buffer).field_0x1c = uVar7;
      (win->buffer).base = pnVar4;
      (win->buffer).clip.x = fVar8;
      (win->buffer).clip.y = fVar9;
      nk_start_popup(ctx,win_00);
      nVar3 = (ctx->memory).allocated;
      r.w = 16384.0;
      r.h = 16384.0;
      r.x = -8192.0;
      r.y = -8192.0;
      nk_push_scissor(&win->buffer,r);
      iVar10 = nk_panel_begin(ctx,title,NK_PANEL_POPUP);
      if (iVar10 == 0) {
        for (local_78 = win_00->layout; local_78 != (nk_panel *)0x0; local_78 = local_78->parent) {
          local_78->flags = local_78->flags | 0x10000;
        }
        (win_00->popup).buf.active = 0;
        (win_00->popup).active = 0;
        (ctx->memory).allocated = nVar3;
        ctx->current = win_00;
        nk_free_panel(ctx,win->layout);
        win->layout = (nk_panel *)0x0;
        rect_local.w = 0.0;
      }
      else {
        for (root_1 = win_00->layout; root_1 != (nk_panel *)0x0; root_1 = root_1->parent) {
          root_1->flags = root_1->flags | 0x1000;
          root_1->flags = root_1->flags & 0xfffeffff;
        }
        (win_00->popup).active = 1;
        win->layout->offset_x = &(win->scrollbar).x;
        win->layout->offset_y = &(win->scrollbar).y;
        win->layout->parent = win_00->layout;
        rect_local.w = 1.4013e-45;
      }
    }
    return (int)rect_local.w;
  }
  __assert_fail("ctx->current->layout",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x41b0,
                "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
               );
}

Assistant:

NK_API int
nk_popup_begin(struct nk_context *ctx, enum nk_popup_type type,
    const char *title, nk_flags flags, struct nk_rect rect)
{
    struct nk_window *popup;
    struct nk_window *win;
    struct nk_panel *panel;

    int title_len;
    nk_hash title_hash;
    nk_size allocated;

    NK_ASSERT(ctx);
    NK_ASSERT(title);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    panel = win->layout;
    NK_ASSERT(!(panel->type & NK_PANEL_SET_POPUP) && "popups are not allowed to have popups");
    (void)panel;
    title_len = (int)nk_strlen(title);
    title_hash = nk_murmur_hash(title, (int)title_len, NK_PANEL_POPUP);

    popup = win->popup.win;
    if (!popup) {
        popup = (struct nk_window*)nk_create_window(ctx);
        popup->parent = win;
        win->popup.win = popup;
        win->popup.active = 0;
        win->popup.type = NK_PANEL_POPUP;
    }

    /* make sure we have correct popup */
    if (win->popup.name != title_hash) {
        if (!win->popup.active) {
            nk_zero(popup, sizeof(*popup));
            win->popup.name = title_hash;
            win->popup.active = 1;
            win->popup.type = NK_PANEL_POPUP;
        } else return 0;
    }

    /* popup position is local to window */
    ctx->current = popup;
    rect.x += win->layout->clip.x;
    rect.y += win->layout->clip.y;

    /* setup popup data */
    popup->parent = win;
    popup->bounds = rect;
    popup->seq = ctx->seq;
    popup->layout = (struct nk_panel*)nk_create_panel(ctx);
    popup->flags = flags;
    popup->flags |= NK_WINDOW_BORDER;
    if (type == NK_POPUP_DYNAMIC)
        popup->flags |= NK_WINDOW_DYNAMIC;

    popup->buffer = win->buffer;
    nk_start_popup(ctx, win);
    allocated = ctx->memory.allocated;
    nk_push_scissor(&popup->buffer, nk_null_rect);

    if (nk_panel_begin(ctx, title, NK_PANEL_POPUP)) {
        /* popup is running therefore invalidate parent panels */
        struct nk_panel *root;
        root = win->layout;
        while (root) {
            root->flags |= NK_WINDOW_ROM;
            root->flags &= ~(nk_flags)NK_WINDOW_REMOVE_ROM;
            root = root->parent;
        }
        win->popup.active = 1;
        popup->layout->offset_x = &popup->scrollbar.x;
        popup->layout->offset_y = &popup->scrollbar.y;
        popup->layout->parent = win->layout;
        return 1;
    } else {
        /* popup was closed/is invalid so cleanup */
        struct nk_panel *root;
        root = win->layout;
        while (root) {
            root->flags |= NK_WINDOW_REMOVE_ROM;
            root = root->parent;
        }
        win->popup.buf.active = 0;
        win->popup.active = 0;
        ctx->memory.allocated = allocated;
        ctx->current = win;
        nk_free_panel(ctx, popup->layout);
        popup->layout = 0;
        return 0;
    }
}